

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QWidget *label,QWidget *field)

{
  bool bVar1;
  int iVar2;
  QWidget *in_RCX;
  long in_RDX;
  QFormLayoutPrivate *in_RDI;
  QWidget *unaff_retaddr;
  QLayoutPrivate *in_stack_00000008;
  QFormLayoutPrivate *d;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  
  d_func((QFormLayout *)0x4b5c8a);
  if (((in_RDX == 0) ||
      (bVar1 = QLayoutPrivate::checkWidget(in_stack_00000008,unaff_retaddr), bVar1)) &&
     ((in_RCX == (QWidget *)0x0 ||
      (bVar1 = QLayoutPrivate::checkWidget(in_stack_00000008,unaff_retaddr), bVar1)))) {
    iVar2 = QFormLayoutPrivate::insertRow(in_RDI,in_stack_ffffffffffffffcc);
    if (in_RDX != 0) {
      QFormLayoutPrivate::setWidget
                ((QFormLayoutPrivate *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDX >> 0x20),(ItemRole)in_RDX,in_RCX);
    }
    if (in_RCX != (QWidget *)0x0) {
      QFormLayoutPrivate::setWidget
                ((QFormLayoutPrivate *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDX >> 0x20),(ItemRole)in_RDX,in_RCX);
    }
    (**(code **)(*(long *)&in_RDI->super_QLayoutPrivate + 0x70))();
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, QWidget *label, QWidget *field)
{
    Q_D(QFormLayout);
    if ((label && !d->checkWidget(label)) || (field && !d->checkWidget(field)))
        return;

    row = d->insertRow(row);
    if (label)
        d->setWidget(row, LabelRole, label);
    if (field)
        d->setWidget(row, FieldRole, field);
    invalidate();
}